

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,char_writer *f)

{
  undefined8 *puVar1;
  long lVar2;
  byte bVar3;
  ulong uVar4;
  char *pcVar5;
  fill_t<char> *fill;
  size_t n;
  
  if ((ulong)(uint)specs->width < 2) {
    puVar1 = *(undefined8 **)this;
    lVar2 = puVar1[2];
    uVar4 = lVar2 + 1;
    if ((ulong)puVar1[3] < uVar4) {
      (**(code **)*puVar1)(puVar1,uVar4);
    }
    puVar1[2] = uVar4;
    *(char_type *)(puVar1[1] + lVar2) = f->value;
    return;
  }
  n = (ulong)(uint)specs->width - 1;
  puVar1 = *(undefined8 **)this;
  lVar2 = puVar1[2];
  uVar4 = (specs->fill).size_ * n + lVar2 + 1;
  if ((ulong)puVar1[3] < uVar4) {
    (**(code **)*puVar1)(puVar1,uVar4);
  }
  puVar1[2] = uVar4;
  pcVar5 = (char *)(lVar2 + puVar1[1]);
  fill = &specs->fill;
  bVar3 = specs->field_0x9 & 0xf;
  if (bVar3 == 3) {
    pcVar5 = fill<char*,char>(pcVar5,n >> 1,fill);
    *pcVar5 = f->value;
    n = n - (n >> 1);
  }
  else {
    if (bVar3 == 2) {
      pcVar5 = fill<char*,char>(pcVar5,n,fill);
      *pcVar5 = f->value;
      return;
    }
    *pcVar5 = f->value;
  }
  fill<char*,char>(pcVar5 + 1,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }